

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdReport.cpp
# Opt level: O0

int CmdReport(CLI *cli,Rules *rules,Database *database,Extensions *extensions)

{
  allocator<std::shared_ptr<IntervalFilter>_> *this;
  initializer_list<std::shared_ptr<IntervalFilter>_> __l;
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  reference pAVar4;
  ulong uVar5;
  string *this_00;
  string *__return_storage_ptr__;
  reference pbVar6;
  ostream *poVar7;
  shared_ptr<IntervalFilter> *local_938;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *line;
  iterator __end1_2;
  iterator __begin1_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_888;
  allocator<char> local_861;
  string local_860;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_840;
  int local_824;
  undefined1 local_820 [4];
  int rc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  output;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c8;
  undefined1 local_7a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> input;
  string local_780;
  string local_760;
  reference local_740;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  iterator __end1_1;
  iterator __begin1_1;
  string local_720;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_700;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_6e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  stringstream header;
  ostream local_6d0 [383];
  allocator<char> local_551;
  string local_550;
  allocator<char> local_529;
  string local_528;
  allocator<char> local_501;
  string local_500;
  string local_4e0;
  allocator<char> local_4b9;
  string local_4b8;
  byte local_492;
  allocator<char> local_491;
  string local_490;
  allocator<char> local_469;
  string local_468;
  byte local_442;
  allocator<char> local_441;
  string local_440;
  allocator<char> local_419;
  string local_418;
  undefined1 local_3f8 [8];
  vector<Interval,_std::allocator<Interval>_> tracked;
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [24];
  undefined1 local_3b0 [32];
  shared_ptr<IntervalFilter> local_390;
  vector<std::shared_ptr<IntervalFilter>,_std::allocator<std::shared_ptr<IntervalFilter>_>_>
  local_380;
  undefined1 local_368 [8];
  IntervalFilterAndGroup filtering;
  Range range;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tags;
  undefined1 auStack_288 [8];
  Range default_range;
  allocator<char> local_1f9;
  string local_1f8;
  string local_1d8;
  undefined1 local_1b8 [8];
  string report_hint;
  string local_190;
  allocator<char> local_169;
  string local_168;
  undefined1 local_148 [8];
  string default_hint;
  string script_name;
  string local_100;
  string local_e0;
  string local_c0;
  allocator<char> local_89;
  string local_88;
  reference local_68;
  A2 *arg;
  iterator __end1;
  iterator __begin1;
  vector<A2,_std::allocator<A2>_> *__range1;
  string script_path;
  Extensions *extensions_local;
  Database *database_local;
  Rules *rules_local;
  CLI *cli_local;
  
  script_path.field_2._8_8_ = extensions;
  std::__cxx11::string::string((string *)&__range1);
  __end1 = std::vector<A2,_std::allocator<A2>_>::begin(&cli->_args);
  arg = (A2 *)std::vector<A2,_std::allocator<A2>_>::end(&cli->_args);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<A2_*,_std::vector<A2,_std::allocator<A2>_>_>
                                     *)&arg), bVar2) {
    pAVar4 = __gnu_cxx::__normal_iterator<A2_*,_std::vector<A2,_std::allocator<A2>_>_>::operator*
                       (&__end1);
    local_68 = pAVar4;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"EXT",&local_89);
    bVar2 = A2::hasTag(pAVar4,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
    uVar1 = script_path.field_2._8_8_;
    pAVar4 = local_68;
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_100,"canonical",
                 (allocator<char> *)(script_name.field_2._M_local_buf + 0xf));
      A2::attribute(&local_e0,pAVar4,&local_100);
      findExtension(&local_c0,(Extensions *)uVar1,&local_e0);
      std::__cxx11::string::operator=((string *)&__range1,(string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
      std::allocator<char>::~allocator((allocator<char> *)(script_name.field_2._M_local_buf + 0xf));
    }
    __gnu_cxx::__normal_iterator<A2_*,_std::vector<A2,_std::allocator<A2>_>_>::operator++(&__end1);
  }
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) != 0) {
    script_name.field_2._M_local_buf[0xd] = '\x01';
    this_00 = (string *)__cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,"Specify which report to run.",
               (allocator<char> *)(script_name.field_2._M_local_buf + 0xe));
    script_name.field_2._M_local_buf[0xd] = '\0';
    __cxa_throw(this_00,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  getScriptName((string *)((long)&default_hint.field_2 + 8),(string *)&__range1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_168,"reports.range",&local_169);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_190,"all",(allocator<char> *)(report_hint.field_2._M_local_buf + 0xf))
  ;
  Rules::get((string *)local_148,rules,&local_168,&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator((allocator<char> *)(report_hint.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator(&local_169);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"reports.{1}.range",&local_1f9);
  std::__cxx11::string::string
            ((string *)&default_range.end._date,(string *)(default_hint.field_2._M_local_buf + 8));
  format<std::__cxx11::string>
            (&local_1d8,&local_1f8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &default_range.end._date);
  Rules::get((string *)local_1b8,rules,&local_1d8,(string *)local_148);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&default_range.end._date);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  default_range.end._julian = 0;
  default_range.end._day = 0;
  default_range.end._seconds = 0;
  default_range.end._offset = 0;
  default_range.end._year = 0;
  default_range.end._month = 0;
  default_range.end._week = 0;
  default_range.end._weekday = 0;
  default_range.start._utc = false;
  default_range.start._33_7_ = 0;
  default_range.start._date = 0;
  default_range.start._julian = 0;
  default_range.start._day = 0;
  default_range.start._seconds = 0;
  default_range.start._offset = 0;
  default_range.start._year = 0;
  default_range.start._month = 0;
  default_range.start._week = 0;
  default_range.start._weekday = 0;
  auStack_288 = (undefined1  [8])0x0;
  default_range._vptr_Range = (_func_int **)0x0;
  default_range.end._utc = false;
  default_range.end._33_7_ = 0;
  Range::Range((Range *)auStack_288);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &tags._M_t._M_impl.super__Rb_tree_header._M_node_count,":",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8);
  expandIntervalHint((string *)&tags._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (Range *)auStack_288);
  std::__cxx11::string::~string((string *)&tags._M_t._M_impl.super__Rb_tree_header._M_node_count);
  CLI::getTags_abi_cxx11_
            ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&range.end._date,cli);
  CLI::getRange((Range *)&filtering._filters.
                          super__Vector_base<std::shared_ptr<IntervalFilter>,_std::allocator<std::shared_ptr<IntervalFilter>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,cli,
                (Range *)auStack_288);
  tracked.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = 1;
  local_3c8._16_8_ = local_3b0;
  std::make_shared<IntervalFilterAllInRange,Range&>((Range *)local_3c8);
  std::shared_ptr<IntervalFilter>::shared_ptr<IntervalFilterAllInRange,void>
            ((shared_ptr<IntervalFilter> *)local_3b0,
             (shared_ptr<IntervalFilterAllInRange> *)local_3c8);
  local_3c8._16_8_ = (_Base_ptr)(local_3b0 + 0x10);
  std::
  make_shared<IntervalFilterAllWithTags,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&>
            ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_3d8);
  std::shared_ptr<IntervalFilter>::shared_ptr<IntervalFilterAllWithTags,void>
            ((shared_ptr<IntervalFilter> *)(local_3b0 + 0x10),
             (shared_ptr<IntervalFilterAllWithTags> *)local_3d8);
  tracked.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = 0;
  local_390.super___shared_ptr<IntervalFilter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_3b0;
  local_390.super___shared_ptr<IntervalFilter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
  this = (allocator<std::shared_ptr<IntervalFilter>_> *)
         ((long)&tracked.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 6);
  std::allocator<std::shared_ptr<IntervalFilter>_>::allocator(this);
  __l._M_len = (size_type)
               local_390.super___shared_ptr<IntervalFilter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
  __l._M_array = (iterator)
                 local_390.super___shared_ptr<IntervalFilter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::vector<std::shared_ptr<IntervalFilter>,_std::allocator<std::shared_ptr<IntervalFilter>_>_>::
  vector(&local_380,__l,this);
  IntervalFilterAndGroup::IntervalFilterAndGroup((IntervalFilterAndGroup *)local_368,&local_380);
  std::vector<std::shared_ptr<IntervalFilter>,_std::allocator<std::shared_ptr<IntervalFilter>_>_>::
  ~vector(&local_380);
  std::allocator<std::shared_ptr<IntervalFilter>_>::~allocator
            ((allocator<std::shared_ptr<IntervalFilter>_> *)
             ((long)&tracked.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 6));
  local_938 = &local_390;
  do {
    local_938 = local_938 + -1;
    std::shared_ptr<IntervalFilter>::~shared_ptr(local_938);
  } while (local_938 != (shared_ptr<IntervalFilter> *)local_3b0);
  std::shared_ptr<IntervalFilterAllWithTags>::~shared_ptr
            ((shared_ptr<IntervalFilterAllWithTags> *)local_3d8);
  std::shared_ptr<IntervalFilterAllInRange>::~shared_ptr
            ((shared_ptr<IntervalFilterAllInRange> *)local_3c8);
  getTracked((vector<Interval,_std::allocator<Interval>_> *)local_3f8,database,rules,
             (IntervalFilter *)local_368);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_418,"temp.report.start",&local_419);
  local_442 = 0;
  bVar2 = Range::is_started((Range *)&filtering._filters.
                                      super__Vector_base<std::shared_ptr<IntervalFilter>,_std::allocator<std::shared_ptr<IntervalFilter>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (bVar2) {
    Datetime::toISO_abi_cxx11_(&local_440,(Datetime *)&range);
  }
  else {
    std::allocator<char>::allocator();
    local_442 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_440,"",&local_441);
  }
  Rules::set(rules,&local_418,&local_440);
  std::__cxx11::string::~string((string *)&local_440);
  if ((local_442 & 1) != 0) {
    std::allocator<char>::~allocator(&local_441);
  }
  std::__cxx11::string::~string((string *)&local_418);
  std::allocator<char>::~allocator(&local_419);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_468,"temp.report.end",&local_469);
  local_492 = 0;
  bVar2 = Range::is_ended((Range *)&filtering._filters.
                                    super__Vector_base<std::shared_ptr<IntervalFilter>,_std::allocator<std::shared_ptr<IntervalFilter>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (bVar2) {
    Datetime::toISO_abi_cxx11_(&local_490,(Datetime *)&range.start._date);
  }
  else {
    std::allocator<char>::allocator();
    local_492 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_490,"",&local_491);
  }
  Rules::set(rules,&local_468,&local_490);
  std::__cxx11::string::~string((string *)&local_490);
  if ((local_492 & 1) != 0) {
    std::allocator<char>::~allocator(&local_491);
  }
  std::__cxx11::string::~string((string *)&local_468);
  std::allocator<char>::~allocator(&local_469);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4b8,"temp.report.tags",&local_4b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_500,",",&local_501);
  joinQuotedIfNeeded<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
            (&local_4e0,&local_500,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&range.end._date);
  Rules::set(rules,&local_4b8,&local_4e0);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::__cxx11::string::~string((string *)&local_500);
  std::allocator<char>::~allocator(&local_501);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::allocator<char>::~allocator(&local_4b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_528,"temp.version",&local_529)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_550,"1.8.0-dev",&local_551);
  Rules::set(rules,&local_528,&local_550);
  std::__cxx11::string::~string((string *)&local_550);
  std::allocator<char>::~allocator(&local_551);
  std::__cxx11::string::~string((string *)&local_528);
  std::allocator<char>::~allocator(&local_529);
  std::__cxx11::stringstream::stringstream((stringstream *)&__range1_1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_720,"",(allocator<char> *)((long)&__begin1_1._M_current + 7));
  Rules::all(&local_700,rules,&local_720);
  std::__cxx11::string::~string((string *)&local_720);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__begin1_1._M_current + 7));
  local_6e8 = &local_700;
  __end1_1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(local_6e8);
  name = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(local_6e8);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&name), bVar2) {
    local_740 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end1_1);
    poVar7 = std::operator<<(local_6d0,(string *)local_740);
    poVar7 = std::operator<<(poVar7,": ");
    pbVar6 = local_740;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_780,"",(allocator<char> *)(input.field_2._M_local_buf + 0xf));
    Rules::get(&local_760,rules,pbVar6,&local_780);
    poVar7 = std::operator<<(poVar7,(string *)&local_760);
    std::operator<<(poVar7,'\n');
    std::__cxx11::string::~string((string *)&local_760);
    std::__cxx11::string::~string((string *)&local_780);
    std::allocator<char>::~allocator((allocator<char> *)(input.field_2._M_local_buf + 0xf));
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1_1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_700);
  std::__cxx11::stringstream::str();
  std::operator+(&local_7c8,&local_7e8,'\n');
  jsonFromIntervals_abi_cxx11_
            ((string *)
             &output.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<Interval,_std::allocator<Interval>_> *)local_3f8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7a8,
                 &local_7c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &output.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string
            ((string *)
             &output.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&local_7c8);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_820);
  uVar1 = script_path.field_2._8_8_;
  split(&local_840,(string *)local_7a8,'\n');
  iVar3 = Extensions::callExtension
                    ((Extensions *)uVar1,(string *)&__range1,&local_840,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_820);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_840);
  local_824 = iVar3;
  if ((iVar3 != 0) &&
     (bVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_820), bVar2)) {
    __return_storage_ptr__ = (string *)__cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_860,"\'{1}\' returned {2} without producing output.",&local_861);
    std::__cxx11::string::string((string *)&local_888,(string *)&__range1);
    format<std::__cxx11::string,int>(__return_storage_ptr__,&local_860,&local_888,local_824);
    __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string
               );
  }
  __end1_2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_820);
  line = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_820);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1_2,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&line), iVar3 = local_824, bVar2) {
    pbVar6 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1_2);
    poVar7 = std::operator<<((ostream *)&std::cout,(string *)pbVar6);
    std::operator<<(poVar7,'\n');
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1_2);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_820);
  std::__cxx11::string::~string((string *)local_7a8);
  std::__cxx11::stringstream::~stringstream((stringstream *)&__range1_1);
  std::vector<Interval,_std::allocator<Interval>_>::~vector
            ((vector<Interval,_std::allocator<Interval>_> *)local_3f8);
  IntervalFilterAndGroup::~IntervalFilterAndGroup((IntervalFilterAndGroup *)local_368);
  Range::~Range((Range *)&filtering._filters.
                          super__Vector_base<std::shared_ptr<IntervalFilter>,_std::allocator<std::shared_ptr<IntervalFilter>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&range.end._date);
  Range::~Range((Range *)auStack_288);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::string::~string((string *)local_148);
  std::__cxx11::string::~string((string *)(default_hint.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&__range1);
  return iVar3;
}

Assistant:

int CmdReport (
  CLI& cli,
  Rules& rules,
  Database& database,
  const Extensions& extensions)
{
  std::string script_path;
  for (auto& arg : cli._args)
  {
    if (arg.hasTag ("EXT"))
    {
      script_path = findExtension (extensions, arg.attribute ("canonical"));
    }
  }

  if (script_path.empty ())
  {
    throw std::string ("Specify which report to run.");
  }

  auto script_name = getScriptName (script_path);
  auto default_hint = rules.get ("reports.range", "all");
  auto report_hint = rules.get (format ("reports.{1}.range", script_name), default_hint);

  Range default_range = {};
  expandIntervalHint (":" + report_hint, default_range);

  // Create a filter, and if empty, choose the current week.
  auto tags = cli.getTags ();
  auto range = cli.getRange (default_range);

  IntervalFilterAndGroup filtering ({
    std::make_shared <IntervalFilterAllInRange> (range),
    std::make_shared <IntervalFilterAllWithTags> (tags)
  });

  auto tracked = getTracked (database, rules, filtering);

  // Compose Header info.
  rules.set ("temp.report.start", range.is_started () ? range.start.toISO () : "");
  rules.set ("temp.report.end",   range.is_ended ()   ? range.end.toISO ()   : "");
  rules.set ("temp.report.tags", joinQuotedIfNeeded (",", tags));
  rules.set ("temp.version", VERSION);

  std::stringstream header;

  for (auto& name : rules.all ())
  {
    header << name << ": " << rules.get (name) << '\n';
  }

  // Get the data.
  auto input = header.str ()
             + '\n'
             + jsonFromIntervals (tracked);

  // Run the extensions.
  std::vector <std::string> output;
  int rc = extensions.callExtension (script_path, split (input, '\n'), output);
  if (rc != 0 && output.empty ())
  {
    throw format ("'{1}' returned {2} without producing output.", script_path, rc);
  }

  // Display the output.
  for (auto& line : output)
  {
    std::cout << line << '\n';
  }

  return rc;
}